

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

hittable_list * simple_light(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this;
  hittable_list *in_RDI;
  undefined1 local_cc [4];
  undefined1 local_c8 [16];
  shared_ptr<diffuse_light> difflight;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  undefined8 local_98;
  shared_ptr<noise_texture> pertext;
  undefined1 local_74 [12];
  value_type local_68;
  value_type local_58;
  value_type local_48;
  value_type local_38;
  
  (in_RDI->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (element_type *)CONCAT44(local_a8._4_4_,4);
  std::make_shared<noise_texture,int>((int *)&pertext);
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc08f400000000000;
  local_98 = 0;
  local_cc = (undefined1  [4])0x3e8;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)local_c8);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)&difflight,(int *)&stack0xffffffffffffff58,(shared_ptr<lambertian> *)local_cc);
  this = &in_RDI->objects;
  local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_98 = 0;
  local_cc = (undefined1  [4])0x2;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)local_c8);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)&difflight,(int *)&stack0xffffffffffffff58,(shared_ptr<lambertian> *)local_cc);
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  local_a8 = (element_type *)0x4010000000000000;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4010000000000000;
  local_98 = 0x4010000000000000;
  std::make_shared<constant_texture,vec3>((vec3 *)local_c8);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>
            ((shared_ptr<constant_texture> *)&difflight);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  local_98 = 0;
  local_cc = (undefined1  [4])0x2;
  std::make_shared<sphere,vec3,int,std::shared_ptr<diffuse_light>&>
            ((vec3 *)local_c8,(int *)&stack0xffffffffffffff58,(shared_ptr<diffuse_light> *)local_cc)
  ;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._0_8_;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
  local_c8._0_8_ = (element_type *)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  local_74._4_4_ = 3;
  local_c8._0_4_ = 3;
  local_cc = (undefined1  [4])0x5;
  local_74._8_4_ = 1;
  local_74._0_4_ = 0xfffffffe;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&stack0xffffffffffffff58,(int *)local_c8,(int *)local_cc,(int *)(local_74 + 8),
             (int *)(local_74 + 4),(shared_ptr<diffuse_light> *)local_74);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_a0._M_pi;
  local_a8 = (element_type *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&difflight.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return in_RDI;
}

Assistant:

hittable_list simple_light() {
    hittable_list objects;

    auto pertext = make_shared<noise_texture>(4);
    objects.add(make_shared<sphere>(vec3(0,-1000, 0), 1000, make_shared<lambertian>(pertext)));
    objects.add(make_shared<sphere>(vec3(0,2,0), 2, make_shared<lambertian>(pertext)));

    auto difflight = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(4,4,4)));
    objects.add(make_shared<sphere>(vec3(0,7,0), 2, difflight));
    objects.add(make_shared<xy_rect>(3, 5, 1, 3, -2, difflight));

    return objects;
}